

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::GetDiagValueString
          (JavascriptArray *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  StringBuilder<Memory::ArenaAllocator> **this_00;
  bool bVar1;
  ThreadContext *this_01;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  anon_class_24_3_ff518c6f funcPtr;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptArray *this_local;
  
  funcPtr.stringBuilder = (StringBuilder<Memory::ArenaAllocator> **)requestContext;
  requestContext_local = (ScriptContext *)stringBuilder;
  stringBuilder_local = (StringBuilder<Memory::ArenaAllocator> *)this;
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'[');
  if ((this->super_ArrayObject).length < 10) {
    funcPtr.this = (JavascriptArray *)&funcPtr.stringBuilder;
    funcPtr.requestContext = &requestContext_local;
    __localScriptContext = (ScriptContext *)this;
    this_01 = ScriptContext::GetThreadContext((ScriptContext *)funcPtr.stringBuilder);
    bVar1 = ThreadContext::IsScriptActive(this_01);
    this_00 = funcPtr.stringBuilder;
    if (bVar1) {
      GetDiagValueString::anon_class_24_3_ff518c6f::operator()
                ((anon_class_24_3_ff518c6f *)&__localScriptContext);
    }
    else {
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_a0,(ScriptContext *)funcPtr.stringBuilder,
                 (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                 &stack0x00000000,true,false,false);
      ScriptContext::OnScriptStart((ScriptContext *)this_00,false,true);
      EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
      GetDiagValueString::anon_class_24_3_ff518c6f::operator()
                ((anon_class_24_3_ff518c6f *)&__localScriptContext);
      EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
    }
  }
  else {
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<4ul>
              ((StringBuilder<Memory::ArenaAllocator> *)requestContext_local,
               (char16 (*) [4])0x18827e0);
  }
  StringBuilder<Memory::ArenaAllocator>::Append
            ((StringBuilder<Memory::ArenaAllocator> *)requestContext_local,L']');
  return 1;
}

Assistant:

BOOL JavascriptArray::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('['));

        if (this->length < 10)
        {
            auto funcPtr = [&]()
            {
                ENTER_PINNED_SCOPE(JavascriptString, valueStr);
                valueStr = JavascriptArray::JoinHelper(this, GetLibrary()->GetCommaDisplayString(), requestContext);
                stringBuilder->Append(valueStr->GetString(), valueStr->GetLength());
                LEAVE_PINNED_SCOPE();
            };

            if (!requestContext->GetThreadContext()->IsScriptActive())
            {
                BEGIN_JS_RUNTIME_CALL(requestContext);
                {
                    funcPtr();
                }
                END_JS_RUNTIME_CALL(requestContext);
            }
            else
            {
                funcPtr();
            }
        }
        else
        {
            stringBuilder->AppendCppLiteral(_u("..."));
        }

        stringBuilder->Append(_u(']'));

        return TRUE;
    }